

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

void ScaWrd(GmfMshSct *msh,void *ptr)

{
  size_t sVar1;
  
  sVar1 = fread(ptr,4,1,(FILE *)msh->hdl);
  if (sVar1 != 1) {
    longjmp((__jmp_buf_tag *)msh->err,-0x1a);
  }
  if (msh->cod == 1) {
    return;
  }
  SwpWrd((char *)ptr,4);
  return;
}

Assistant:

static void ScaWrd(GmfMshSct *msh, void *ptr)
{
#ifdef WITH_GMF_AIO
   if(read(msh->FilDes, ptr, WrdSiz) != WrdSiz)
#else
   if(fread(ptr, WrdSiz, 1, msh->hdl) != 1)
#endif
      longjmp(msh->err, -26);

   if(msh->cod != 1)
      SwpWrd((char *)ptr, WrdSiz);
}